

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Cpu.cpp
# Opt level: O0

void __thiscall Gb_Cpu::map_code(Gb_Cpu *this,gb_addr_t start,uint size,void *data)

{
  uint uVar1;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  Gb_Cpu *in_RDI;
  uint i;
  uint first_page;
  undefined4 local_20;
  
  local_20 = in_EDX >> 0xd;
  while (uVar1 = local_20 - 1, local_20 != 0) {
    set_code_page(in_RDI,(in_ESI >> 0xd) + uVar1,(uint8_t *)(in_RCX + (ulong)(uVar1 * 0x2000)));
    local_20 = uVar1;
  }
  return;
}

Assistant:

void Gb_Cpu::map_code( gb_addr_t start, unsigned size, void* data )
{
	// address range must begin and end on page boundaries
	require( start % page_size == 0 );
	require( size % page_size == 0 );
	
	unsigned first_page = start / page_size;
	for ( unsigned i = size / page_size; i--; )
		set_code_page( first_page + i, (uint8_t*) data + i * page_size );
}